

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O2

void __thiscall CPU::MOS6502::State::Inputs::Inputs(Inputs *this)

{
  allocator<char> local_29;
  string local_28;
  
  (this->super_StructImpl<CPU::MOS6502::State::Inputs>).super_Struct._vptr_Struct =
       (_func_int **)&PTR_all_keys_abi_cxx11__0058db00;
  if (Reflection::StructImpl<CPU::MOS6502::State::Inputs>::contents__abi_cxx11_._M_h.
      _M_element_count == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"ready",&local_29);
    Reflection::StructImpl<CPU::MOS6502::State::Inputs>::declare<bool>
              (&this->super_StructImpl<CPU::MOS6502::State::Inputs>,&this->ready,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"irq",&local_29);
    Reflection::StructImpl<CPU::MOS6502::State::Inputs>::declare<bool>
              (&this->super_StructImpl<CPU::MOS6502::State::Inputs>,&this->irq,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"nmi",&local_29);
    Reflection::StructImpl<CPU::MOS6502::State::Inputs>::declare<bool>
              (&this->super_StructImpl<CPU::MOS6502::State::Inputs>,&this->nmi,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"reset",&local_29);
    Reflection::StructImpl<CPU::MOS6502::State::Inputs>::declare<bool>
              (&this->super_StructImpl<CPU::MOS6502::State::Inputs>,&this->reset,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
  }
  return;
}

Assistant:

State::Inputs::Inputs() {
	if(needs_declare()) {
		DeclareField(ready);
		DeclareField(irq);
		DeclareField(nmi);
		DeclareField(reset);
	}
}